

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::callAndPollForResponse
          (AeronArchive *this,function<bool_(long)> *f,char *request)

{
  bool bVar1;
  int64_t iVar2;
  ArchiveException *this_00;
  char *pcVar3;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  unique_lock<std::mutex> lock;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->lock_);
  iVar2 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_toDriverRingBuffer);
  bVar1 = std::function<bool_(long)>::operator()(f,iVar2);
  if (bVar1) {
    iVar2 = pollForResponse(this,iVar2);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return iVar2;
  }
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_68,request,&local_b9);
  std::operator+(&local_48,&local_68,": failed to send");
  std::__cxx11::string::string
            ((string *)&local_88,
             "std::int64_t aeron::archive::AeronArchive::callAndPollForResponse(std::function<bool (std::int64_t)> &&, const char *)"
             ,&local_ba);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_bb);
  ArchiveException::ArchiveException(this_00,&local_48,&local_88,&local_a8,0x1c1);
  __cxa_throw(this_00,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t AeronArchive::callAndPollForResponse(std::function<bool(std::int64_t)>&& f, const char* request) {
    std::unique_lock<std::mutex> lock(lock_);

    std::int64_t correlationId = aeron_->nextCorrelationId();

    if (!f(correlationId)) {
        throw ArchiveException(std::string(request) + ": failed to send", SOURCEINFO);
    }

    return pollForResponse(correlationId);
}